

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

QHttp2Connection *
QHttp2Connection::createUpgradedConnection(QIODevice *socket,QHttp2Configuration *config)

{
  long lVar1;
  unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *this;
  pointer pQVar2;
  pointer pQVar3;
  QHttp2Connection *in_RSI;
  long in_FS_OFFSET;
  QHttp2Stream *stream;
  unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> connection;
  pointer in_stack_ffffffffffffff98;
  QIODevice *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  pointer local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)operator_new(0x2b8)
  ;
  QHttp2Connection((QHttp2Connection *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                   ,in_stack_ffffffffffffffa8);
  std::unique_ptr<QHttp2Connection,std::default_delete<QHttp2Connection>>::
  unique_ptr<std::default_delete<QHttp2Connection>,void>(this,in_stack_ffffffffffffff98);
  pQVar2 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::operator->
                     ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                      0x2b5051);
  QHttp2Configuration::QHttp2Configuration
            ((QHttp2Configuration *)this,(QHttp2Configuration *)in_stack_ffffffffffffff98);
  setH2Configuration((QHttp2Connection *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (QHttp2Configuration *)pQVar2);
  QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)0x2b507e);
  pQVar3 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::operator->
                     ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                      0x2b5088);
  pQVar3->m_connectionType = Client;
  pQVar3 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::operator->
                     ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                      0x2b5099);
  pQVar3->m_upgradedConnection = true;
  std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::operator->
            ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)0x2b50aa);
  createLocalStreamInternal(in_RSI);
  QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError>::unwrap
            ((QH2Expected<QHttp2Stream_*,_QHttp2Connection::CreateStreamError> *)0x2b50c5);
  QHttp2Stream::setState((QHttp2Stream *)pQVar2,(State)((ulong)this >> 0x20));
  pQVar2 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::operator->
                     ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                      0x2b50e3);
  if ((pQVar2->m_prefaceSent & 1U) == 0) {
    local_30 = (pointer)0x0;
  }
  else {
    local_30 = std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::release
                         ((unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_> *)
                          0x2b5109);
  }
  std::unique_ptr<QHttp2Connection,_std::default_delete<QHttp2Connection>_>::~unique_ptr(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Connection *QHttp2Connection::createUpgradedConnection(QIODevice *socket,
                                                             const QHttp2Configuration &config)
{
    Q_ASSERT(socket);

    auto connection = std::unique_ptr<QHttp2Connection>(new QHttp2Connection(socket));
    connection->setH2Configuration(config);
    connection->m_connectionType = QHttp2Connection::Type::Client;
    connection->m_upgradedConnection = true;
    // HTTP2 connection is already established and request was sent, so stream 1
    // is already 'active' and is closed for any further outgoing data.
    QHttp2Stream *stream = connection->createLocalStreamInternal().unwrap();
    Q_ASSERT(stream->streamID() == 1);
    stream->setState(QHttp2Stream::State::HalfClosedLocal);

    if (!connection->m_prefaceSent) // Preface is sent as part of initial stream-creation.
        return nullptr;

    return connection.release();
}